

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O3

AMQP_VALUE
create_uamqp_disposition_result_from(AMQP_MESSENGER_DISPOSITION_RESULT disposition_result)

{
  AMQP_VALUE pAVar1;
  ACCEPTED_HANDLE accepted;
  LOGGER_LOG p_Var2;
  RELEASED_HANDLE released;
  
  if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_NONE) {
    return (AMQP_VALUE)0x0;
  }
  if (disposition_result != AMQP_MESSENGER_DISPOSITION_RESULT_RELEASED) {
    if (disposition_result != AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED) {
      pAVar1 = messaging_delivery_rejected("Rejected by application","Rejected by application");
      return pAVar1;
    }
    accepted = accepted_create();
    if (accepted == (ACCEPTED_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        pAVar1 = (AMQP_VALUE)0x0;
      }
      else {
        pAVar1 = (AMQP_VALUE)0x0;
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                  ,"messaging_delivery_accepted",0x8a,1,
                  "Cannot create ACCEPTED delivery state handle");
      }
    }
    else {
      pAVar1 = amqpvalue_create_accepted(accepted);
      if (pAVar1 == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                    ,"messaging_delivery_accepted",0x92,1,
                    "Cannot create ACCEPTED delivery state AMQP value");
        }
      }
      accepted_destroy(accepted);
    }
    return pAVar1;
  }
  released = released_create();
  if (released == (RELEASED_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar1 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar1 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                ,"messaging_delivery_released",0xe7,1,"Cannot create RELEASED delivery state handle"
               );
    }
  }
  else {
    pAVar1 = amqpvalue_create_released(released);
    if (pAVar1 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/messaging.c"
                  ,"messaging_delivery_released",0xef,1,
                  "Cannot create RELEASED delivery state AMQP value");
      }
    }
    released_destroy(released);
  }
  return pAVar1;
}

Assistant:

static AMQP_VALUE create_uamqp_disposition_result_from(AMQP_MESSENGER_DISPOSITION_RESULT disposition_result)
{
    AMQP_VALUE uamqp_disposition_result;

    if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_NONE)
    {
        uamqp_disposition_result = NULL; // intentionally not sending an answer.
    }
    else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED)
    {
        uamqp_disposition_result = messaging_delivery_accepted();
    }
    else if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_RELEASED)
    {
        uamqp_disposition_result = messaging_delivery_released();
    }
    else // id est, if (disposition_result == AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED)
    {
        uamqp_disposition_result = messaging_delivery_rejected("Rejected by application", "Rejected by application");
    }

    return uamqp_disposition_result;
}